

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.h
# Opt level: O3

void __thiscall
PropertiesDBusInterface::PropertiesDBusInterface
          (PropertiesDBusInterface *this,QString *service,QString *path,QString *interface,
          QDBusConnection *connection,QObject *parent)

{
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLatin1_helper(&local_50);
  if ((&(local_50.d.d)->super_QArrayData == (QArrayData *)0x0) ||
     (1 < ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&local_50,(AllocationOption)local_50.d.size);
  }
  QDBusAbstractInterface::QDBusAbstractInterface
            (&this->super_QDBusAbstractInterface,service,path,(char *)local_50.d.ptr,connection,
             parent);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
    }
  }
  *(undefined ***)this = &PTR_metaObject_001117a8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PropertiesDBusInterface(const QString &service, const QString &path, const QString &interface,
                            const QDBusConnection &connection, QObject *parent = nullptr)
        : QDBusAbstractInterface(service, path, interface.toLatin1().data(), connection, parent)
    {
    }